

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void SubtractionHelper<long,char,17>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (long *lhs,char *rhs,char *result)

{
  char cVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  lVar2 = *lhs;
  cVar1 = *rhs;
  lVar4 = lVar2 - cVar1;
  if (SBORROW8(lVar2,(long)cVar1)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  if (lVar2 < 0) {
    if (lVar4 < -0x80) goto LAB_0010c901;
    bVar6 = -1 < cVar1;
    bVar5 = lVar2 < lVar4;
  }
  else {
    if (0x7f < lVar4) goto LAB_0010c901;
    bVar6 = cVar1 < '\0';
    bVar5 = lVar4 < lVar2;
  }
  if (!(bool)(bVar5 & bVar6)) {
    *result = (char)lVar4;
    return;
  }
LAB_0010c901:
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs std::int64_t, rhs any signed int (including std::int64_t)
        std::int64_t tmp = lhs - rhs;

        // we have essentially 4 cases:
        //
        // 1) lhs positive, rhs positive - overflow not possible in tmp
        // 2) lhs positive, rhs negative - equivalent to addition - result >= lhs or error
        // 3) lhs negative, rhs positive - check result <= lhs
        // 4) lhs negative, rhs negative - overflow not possible in tmp

        if( lhs >= 0 )
        {
            // if both positive, overflow to negative not possible
            // which is why we'll explicitly check maxInt, and not call SafeCast
            if (subtract_corner_case_max< T, U, safeint_internal::int_traits< T >::isLT64Bit>::isOverflowPositive(rhs, lhs, tmp))
            {
                E::SafeIntOnOverflow();
            }
        }
        else
        {
            // lhs negative
            if (subtract_corner_case_max< T, U, safeint_internal::int_traits< T >::isLT64Bit >::isOverflowNegative(rhs, lhs, tmp))
            {
                E::SafeIntOnOverflow();
            }
        }

        result = (T)tmp;
    }